

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tunings.h
# Opt level: O2

void __thiscall Tunings::TuningError::~TuningError(TuningError *this)

{
  *(undefined ***)this = &PTR__TuningError_001a1e10;
  std::__cxx11::string::~string((string *)&this->whatv);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

TuningError(std::string m) : whatv(m) {}